

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRelAggregates::~IfcRelAggregates(IfcRelAggregates *this)

{
  void *pvVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)&this->super_IfcRelDecomposes = 0x896b98;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0xd8 = 0x896c10;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0x88 = 0x896bc0;
  (this->super_IfcRelDecomposes).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x896be8;
  pvVar1 = *(void **)&(this->super_IfcRelDecomposes).
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDecomposes,_2UL>.field_0x18;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcRelDecomposes).field_0xc0 - (long)pvVar1);
  }
  *(undefined8 *)&this->super_IfcRelDecomposes = 0x896cb0;
  *(undefined8 *)&(this->super_IfcRelDecomposes).field_0xd8 = 0x896cd8;
  puVar3 = *(undefined1 **)&(this->super_IfcRelDecomposes).field_0x60;
  puVar2 = &(this->super_IfcRelDecomposes).field_0x70;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  puVar3 = *(undefined1 **)&(this->super_IfcRelDecomposes).field_0x38;
  puVar2 = &(this->super_IfcRelDecomposes).field_0x48;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcRelDecomposes).field_0x10;
  puVar3 = &(this->super_IfcRelDecomposes).field_0x20;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
    return;
  }
  return;
}

Assistant:

IfcRelAggregates() : Object("IfcRelAggregates") {}